

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O2

int skynet_send(skynet_context *context,uint32_t source,uint32_t destination,int type,int session,
               void *data,size_t sz)

{
  void *__ptr;
  int iVar1;
  remote_message *rmsg;
  int iVar2;
  int session_local;
  void *data_local;
  skynet_message smsg;
  
  session_local = session;
  data_local = data;
  if (sz._7_1_ == '\0') {
    _filter_args(context,type,&session_local,&data_local,&sz);
    if (source == 0) {
      source = context->handle;
    }
    iVar2 = session_local;
    if (destination != 0) {
      iVar1 = skynet_harbor_message_isremote(destination);
      __ptr = data_local;
      iVar2 = session_local;
      if (iVar1 == 0) {
        smsg.session = session_local;
        smsg.data = data_local;
        smsg.sz = CONCAT17(sz._7_1_,(undefined7)sz);
        smsg.source = source;
        iVar1 = skynet_context_push(destination,&smsg);
        if (iVar1 != 0) {
          free(__ptr);
          iVar2 = -1;
        }
      }
      else {
        rmsg = (remote_message *)malloc(0x28);
        iVar2 = session_local;
        (rmsg->destination).handle = destination;
        rmsg->message = data_local;
        rmsg->sz = CONCAT17(sz._7_1_,(undefined7)sz);
        skynet_harbor_send(rmsg,source,session_local);
      }
    }
  }
  else {
    skynet_error(context,"The message to %x is too large",(ulong)destination);
    iVar2 = -1;
    if (((uint)type >> 0x10 & 1) != 0) {
      free(data);
    }
  }
  return iVar2;
}

Assistant:

int
skynet_send(struct skynet_context * context, uint32_t source, uint32_t destination , int type, int session, void * data, size_t sz) {
	if ((sz & MESSAGE_TYPE_MASK) != sz) {
		skynet_error(context, "The message to %x is too large", destination);
		if (type & PTYPE_TAG_DONTCOPY) {
			skynet_free(data);
		}
		return -1;
	}
	_filter_args(context, type, &session, (void **)&data, &sz);

	if (source == 0) {
		source = context->handle;
	}

	if (destination == 0) {
		return session;
	}
	if (skynet_harbor_message_isremote(destination)) {
		struct remote_message * rmsg = skynet_malloc(sizeof(*rmsg));
		rmsg->destination.handle = destination;
		rmsg->message = data;
		rmsg->sz = sz;
		skynet_harbor_send(rmsg, source, session);
	} else {
		struct skynet_message smsg;
		smsg.source = source;
		smsg.session = session;
		smsg.data = data;
		smsg.sz = sz;

		if (skynet_context_push(destination, &smsg)) {
			skynet_free(data);
			return -1;
		}
	}
	return session;
}